

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::ImageBlitFromImage::prepare
          (ImageBlitFromImage *this,PrepareContext *context)

{
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar1;
  Context *pCVar2;
  InstanceInterface *vki;
  DeviceInterface *vk;
  VkPhysicalDevice physicalDevice;
  VkDevice device;
  VkCommandPool pool;
  VkImage obj;
  VkDeviceMemory obj_00;
  Handle<(vk::HandleType)7> HVar3;
  DeviceInterface *pDVar4;
  VkAllocationCallbacks *pVVar5;
  Handle<(vk::HandleType)9> HVar6;
  VkCommandBuffer commandBuffer;
  VkResult VVar7;
  deUint32 dVar8;
  ulong uVar9;
  VkDevice pVVar10;
  VkDeviceSize size;
  undefined8 uVar12;
  VkMemoryPropertyFlags in_stack_fffffffffffffe28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c0;
  Move<vk::Handle<(vk::HandleType)7>_> local_1a8;
  undefined8 local_188;
  deUint64 local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined4 local_168;
  Move<vk::Handle<(vk::HandleType)9>_> local_158;
  undefined8 local_138;
  undefined4 local_130;
  int local_12c;
  int local_128;
  undefined4 local_124;
  VkDeviceMemory local_118;
  Deleter<vk::Handle<(vk::HandleType)7>_> DStack_110;
  VkQueue local_f0;
  undefined1 local_e8 [16];
  VkDevice local_d8;
  VkFormat VStack_d0;
  deUint32 dStack_cc;
  deUint32 dStack_c8;
  VkSharingMode VStack_c4;
  deUint32 dStack_c0;
  deUint32 dStack_bc;
  VkSampleCountFlagBits VStack_b8;
  VkImageTiling local_b4;
  VkImageUsageFlags VStack_b0;
  VkSharingMode local_ac;
  deUint32 local_a8;
  pointer local_a0;
  VkImageLayout local_98;
  VkCommandBuffer local_88;
  DeviceInterface *pDStack_80;
  VkDevice local_78;
  undefined8 uStack_70;
  VkBuffer local_68;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_60;
  Random rng;
  int iVar11;
  int iVar13;
  
  pCVar2 = context->m_context;
  vki = pCVar2->m_vki;
  vk = pCVar2->m_vkd;
  physicalDevice = pCVar2->m_physicalDevice;
  device = pCVar2->m_device;
  local_f0 = pCVar2->m_queue;
  pool.m_internal =
       (pCVar2->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
       m_internal;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1c0,&pCVar2->m_queueFamilies);
  uVar12._0_4_ = context->m_currentImageWidth;
  uVar12._4_4_ = context->m_currentImageHeight;
  this->m_imageWidth = (undefined4)uVar12;
  this->m_imageHeight = uVar12._4_4_;
  this->m_imageMemorySize = context->m_currentImageMemorySize;
  if (this->m_scale == BLIT_SCALE_20) {
    iVar11 = (int)(undefined4)uVar12 / 2;
    iVar13 = (int)uVar12._4_4_ / 2;
    uVar12 = CONCAT44(iVar13,iVar11);
    this->m_srcImageWidth = iVar11;
    this->m_srcImageHeight = iVar13;
  }
  else if (this->m_scale == BLIT_SCALE_10) {
    this->m_srcImageWidth = (undefined4)uVar12;
    this->m_srcImageHeight = uVar12._4_4_;
  }
  else {
    uVar12._0_4_ = this->m_srcImageWidth;
    uVar12._4_4_ = this->m_srcImageHeight;
  }
  local_e8._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_e8._8_8_ = (DeviceInterface *)0x0;
  local_d8 = (VkDevice)0x100000000;
  VStack_d0 = VK_FORMAT_R8G8B8A8_UNORM;
  dStack_cc = (deUint32)uVar12;
  dStack_c8 = (deUint32)((ulong)uVar12 >> 0x20);
  VStack_c4 = VK_SHARING_MODE_CONCURRENT;
  dStack_c0 = 1;
  dStack_bc = 1;
  VStack_b8 = VK_SAMPLE_COUNT_1_BIT;
  local_b4 = VK_IMAGE_TILING_OPTIMAL;
  VStack_b0 = 3;
  local_ac = VK_SHARING_MODE_EXCLUSIVE;
  local_a8 = (deUint32)
             ((ulong)((long)local_1c0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_1c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2);
  local_a0 = local_1c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_98 = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::createImage(&local_158,vk,device,(VkImageCreateInfo *)local_e8,(VkAllocationCallbacks *)0x0)
  ;
  pVVar5 = local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  pVVar10 = local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  pDVar4 = local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  HVar6.m_internal =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pMVar1 = &this->m_srcImage;
  obj.m_internal =
       (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  if (obj.m_internal == 0) {
    (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         pVVar10;
    (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         pVVar5;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
         HVar6.m_internal;
    (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
         pDVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,obj)
    ;
    (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
    (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
         local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
    (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
         local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
    if (local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                (&local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
                 (VkImage)local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                          m_internal);
    }
  }
  bindImageMemory(&local_1a8,vki,vk,physicalDevice,device,
                  (VkImage)(pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                           m_internal,in_stack_fffffffffffffe28);
  pVVar5 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
  pVVar10 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
  pDVar4 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
  HVar3.m_internal =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  local_d8 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
  VStack_d0 = (VkFormat)
              local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
  dStack_cc = (deUint32)
              ((ulong)local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
                      m_allocator >> 0x20);
  local_e8._0_8_ = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  local_e8._8_8_ =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  if (obj_00.m_internal == 0) {
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = pVVar10
    ;
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
         pVVar5;
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
         HVar3.m_internal;
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
         pDVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,obj_00
              );
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
         local_d8;
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)CONCAT44(dStack_cc,VStack_d0);
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
         local_e8._0_8_;
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_e8._8_8_;
    if (local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                (&local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
                 (VkDeviceMemory)
                 local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal);
    }
  }
  VStack_d0 = this->m_srcImageWidth * this->m_srcImageHeight * 4;
  local_e8._0_4_ = 0xc;
  local_e8._8_8_ = (DeviceInterface *)0x0;
  local_d8 = (VkDevice)((ulong)local_d8 & 0xffffffff00000000);
  dStack_cc = (int)VStack_d0 >> 0x1f;
  dStack_c8 = 1;
  VStack_c4 = VK_SHARING_MODE_EXCLUSIVE;
  dStack_c0 = (deUint32)
              ((ulong)((long)local_1c0.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)local_1c0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
  VStack_b8 = (VkSampleCountFlagBits)
              local_1c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_b4 = (VkImageTiling)
             ((ulong)local_1c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 0x20);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_1a8,vk,device,
                     (VkBufferCreateInfo *)local_e8,(VkAllocationCallbacks *)0x0);
  local_68.m_internal =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  DStack_60.m_deviceIface =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
  DStack_60.m_device =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
  DStack_60.m_allocator =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
  pVVar10 = device;
  bindBufferMemory((Move<vk::Handle<(vk::HandleType)7>_> *)local_e8,vki,vk,physicalDevice,device,
                   (VkBuffer)
                   local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal,
                   in_stack_fffffffffffffe28);
  DStack_110.m_allocator = (VkAllocationCallbacks *)CONCAT44(dStack_cc,VStack_d0);
  DStack_110.m_device = local_d8;
  local_118.m_internal = local_e8._0_8_;
  DStack_110.m_deviceIface = (DeviceInterface *)local_e8._8_8_;
  createBeginCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_e8,vk,device,pool,(VkCommandBufferLevel)pVVar10)
  ;
  uStack_70 = CONCAT44(dStack_cc,VStack_d0);
  local_78 = local_d8;
  local_88 = (VkCommandBuffer)local_e8._0_8_;
  pDStack_80 = (DeviceInterface *)local_e8._8_8_;
  local_e8._0_4_ = 0x2d;
  local_e8._8_8_ = (DeviceInterface *)0x0;
  local_d8 = (VkDevice)0x100000000000;
  VStack_d0 = VK_FORMAT_UNDEFINED;
  dStack_cc = 7;
  dStack_c8 = 0xffffffff;
  VStack_c4 = ~VK_SHARING_MODE_EXCLUSIVE;
  local_180 = (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
              m_internal;
  dStack_c0 = (deUint32)local_180;
  dStack_bc = (deUint32)(local_180 >> 0x20);
  VStack_b8 = VK_SAMPLE_COUNT_1_BIT;
  local_b4 = VK_IMAGE_TILING_OPTIMAL;
  VStack_b0 = 1;
  local_ac = VK_SHARING_MODE_EXCLUSIVE;
  local_a8 = 1;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal._0_4_ = 0x2d;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = (VkDevice)0x1000
  ;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x600000007;
  local_188 = 0xffffffffffffffff;
  local_178 = 1;
  uStack_170 = 1;
  local_168 = 1;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)&DAT_00000001;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x100000000;
  local_138 = 0;
  local_130 = 0;
  local_12c = this->m_srcImageWidth;
  local_128 = this->m_srcImageHeight;
  local_124 = 1;
  VVar7 = (*vk->_vptr_DeviceInterface[7])
                    (vk,device,local_118.m_internal,0,(long)(local_12c * local_128 * 4),0,&rng);
  ::vk::checkResult(VVar7,"vkd.mapMemory(device, memory, 0, size, 0, &ptr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x2b3);
  deRandom_init(&rng.m_rnd,this->m_seed);
  if ((this->m_srcImageWidth * this->m_srcImageHeight & 0x3fffffffU) == 0) {
    size = 0;
  }
  else {
    uVar9 = 0;
    do {
      dVar8 = deRandom_getUint32(&rng.m_rnd);
      *(char *)(rng.m_rnd._0_8_ + uVar9) = (char)dVar8;
      uVar9 = uVar9 + 1;
      size = (VkDeviceSize)(this->m_srcImageWidth * this->m_srcImageHeight * 4);
    } while (uVar9 < size);
  }
  ::vk::flushMappedMemoryRange(vk,device,local_118,0,size);
  (*vk->_vptr_DeviceInterface[8])(vk,device,local_118.m_internal);
  commandBuffer = local_88;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,local_88,0x10000,0x1000,0,0,0,0,0,1,local_e8);
  (*vk->_vptr_DeviceInterface[0x62])
            (vk,commandBuffer,local_68.m_internal,
             (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal,7,1,
             &local_158);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x1000,0x1000,0,0,0,0,0,1,&local_1a8);
  VVar7 = (*vk->_vptr_DeviceInterface[0x4a])(vk,commandBuffer);
  ::vk::checkResult(VVar7,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0xecd);
  queueRun(vk,local_f0,commandBuffer);
  if (commandBuffer != (VkCommandBuffer)0x0) {
    local_e8._0_8_ = commandBuffer;
    (*pDStack_80->_vptr_DeviceInterface[0x48])(pDStack_80,local_78,uStack_70,1);
  }
  if (local_118.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()(&DStack_110,local_118);
  }
  if (local_68.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_60,local_68);
  }
  if (local_1c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ImageBlitFromImage::prepare (PrepareContext& context)
{
	const vk::InstanceInterface&	vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&		vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice		physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice				device			= context.getContext().getDevice();
	const vk::VkQueue				queue			= context.getContext().getQueue();
	const vk::VkCommandPool			commandPool		= context.getContext().getCommandPool();
	const vector<deUint32>&			queueFamilies	= context.getContext().getQueueFamilies();

	m_imageWidth		= context.getImageWidth();
	m_imageHeight		= context.getImageHeight();
	m_imageMemorySize	= context.getImageMemorySize();

	if (m_scale == BLIT_SCALE_10)
	{
		m_srcImageWidth			= m_imageWidth;
		m_srcImageHeight		= m_imageHeight;
	}
	else if (m_scale == BLIT_SCALE_20)
	{
		m_srcImageWidth			= m_imageWidth / 2;
		m_srcImageHeight		= m_imageHeight / 2;
	}
	else
		DE_FATAL("Unsupported scale");

	{
		const vk::VkImageCreateInfo	createInfo =
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,
			DE_NULL,

			0,
			vk::VK_IMAGE_TYPE_2D,
			vk::VK_FORMAT_R8G8B8A8_UNORM,
			{
				(deUint32)m_srcImageWidth,
				(deUint32)m_srcImageHeight,
				1u,
			},
			1, 1, // mipLevels, arrayLayers
			vk::VK_SAMPLE_COUNT_1_BIT,

			vk::VK_IMAGE_TILING_OPTIMAL,
			vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT|vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
			vk::VK_SHARING_MODE_EXCLUSIVE,

			(deUint32)queueFamilies.size(),
			&queueFamilies[0],
			vk::VK_IMAGE_LAYOUT_UNDEFINED
		};

		m_srcImage = vk::createImage(vkd, device, &createInfo);
	}

	m_memory = bindImageMemory(vki, vkd, physicalDevice, device, *m_srcImage, 0);

	{
		const vk::Unique<vk::VkBuffer>			srcBuffer		(createBuffer(vkd, device, 4 * m_srcImageWidth * m_srcImageHeight, vk::VK_BUFFER_USAGE_TRANSFER_SRC_BIT, vk::VK_SHARING_MODE_EXCLUSIVE, queueFamilies));
		const vk::Unique<vk::VkDeviceMemory>	memory			(bindBufferMemory(vki, vkd, physicalDevice, device, *srcBuffer, vk::VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT));
		const vk::Unique<vk::VkCommandBuffer>	commandBuffer	(createBeginCommandBuffer(vkd, device, commandPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
		const vk::VkImageMemoryBarrier			preImageBarrier	=
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
			DE_NULL,

			0,
			vk::VK_ACCESS_TRANSFER_WRITE_BIT,

			vk::VK_IMAGE_LAYOUT_UNDEFINED,
			vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,

			*m_srcImage,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// Mip level
				1,	// Mip level count
				0,	// Layer
				1	// Layer count
			}
		};
		const vk::VkImageMemoryBarrier			postImageBarrier =
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
			DE_NULL,

			vk::VK_ACCESS_TRANSFER_WRITE_BIT,
			0,

			vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,

			*m_srcImage,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// Mip level
				1,	// Mip level count
				0,	// Layer
				1	// Layer count
			}
		};
		const vk::VkBufferImageCopy				region				=
		{
			0,
			0, 0,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// mipLevel
				0,	// arrayLayer
				1	// layerCount
			},
			{ 0, 0, 0 },
			{
				(deUint32)m_srcImageWidth,
				(deUint32)m_srcImageHeight,
				1u
			}
		};

		{
			void* const	ptr	= mapMemory(vkd, device, *memory, 4 * m_srcImageWidth * m_srcImageHeight);
			de::Random	rng	(m_seed);

			{
				deUint8* const	data = (deUint8*)ptr;

				for (size_t ndx = 0; ndx < (size_t)(4 * m_srcImageWidth * m_srcImageHeight); ndx++)
					data[ndx] = rng.getUint8();
			}

			vk::flushMappedMemoryRange(vkd, device, *memory, 0, 4 * m_srcImageWidth * m_srcImageHeight);
			vkd.unmapMemory(device, *memory);
		}

		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &preImageBarrier);
		vkd.cmdCopyBufferToImage(*commandBuffer, *srcBuffer, *m_srcImage, vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1, &region);
		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);

		VK_CHECK(vkd.endCommandBuffer(*commandBuffer));
		queueRun(vkd, queue, *commandBuffer);
	}
}